

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserDefinedMeasurementCollector.cpp
# Opt level: O2

void __thiscall
celero::UserDefinedMeasurementCollector::UserDefinedMeasurementCollector
          (UserDefinedMeasurementCollector *this,shared_ptr<celero::TestFixture> *fixture)

{
  __shared_ptr<celero::UserDefinedMeasurement,_(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pbVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  udm;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  __shared_ptr<celero::UserDefinedMeasurement,_(__gnu_cxx::_Lock_policy)2> local_68;
  key_type local_50;
  
  (this->collected)._M_h._M_buckets = &(this->collected)._M_h._M_single_bucket;
  (this->collected)._M_h._M_bucket_count = 1;
  (this->collected)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->collected)._M_h._M_element_count = 0;
  (this->collected)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->collected)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->collected)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  TestFixture::getUserDefinedMeasurementNames_abi_cxx11_
            (&local_80,
             (fixture->super___shared_ptr<celero::TestFixture,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  if (local_80.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_80.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    TestFixture::getUserDefinedMeasurementNames_abi_cxx11_
              (&local_98,
               (fixture->super___shared_ptr<celero::TestFixture,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
              );
    for (pbVar1 = local_98.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar1 != local_98.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar1 = pbVar1 + 1) {
      std::__cxx11::string::string((string *)&local_50,(string *)pbVar1);
      local_68._M_ptr = (element_type *)0x0;
      local_68._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this_00 = &std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<celero::UserDefinedMeasurement>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<celero::UserDefinedMeasurement>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<celero::UserDefinedMeasurement>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<celero::UserDefinedMeasurement>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)this,&local_50)->
                 super___shared_ptr<celero::UserDefinedMeasurement,_(__gnu_cxx::_Lock_policy)2>;
      std::__shared_ptr<celero::UserDefinedMeasurement,_(__gnu_cxx::_Lock_policy)2>::operator=
                (this_00,&local_68);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
      std::__cxx11::string::~string((string *)&local_50);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_98);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_80);
  return;
}

Assistant:

UserDefinedMeasurementCollector::UserDefinedMeasurementCollector(std::shared_ptr<TestFixture> fixture)
{
	const auto udm = fixture->getUserDefinedMeasurementNames();

	if(udm.empty() == false)
	{
		for(auto name : fixture->getUserDefinedMeasurementNames())
		{
			this->collected[name] = nullptr;
		}
	}
}